

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

void Tools::deque_remove_element_at_index<PhyloTreeEdge>
               (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *c,size_t index)

{
  _Self local_98;
  _Self local_78;
  const_iterator local_58;
  iterator local_30;
  
  local_98._M_cur =
       (c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_98._M_first =
       (c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_98._M_last =
       (c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_98._M_node =
       (c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  std::operator+(&local_78,&local_98,index);
  local_58._M_cur = local_78._M_cur;
  local_58._M_first = local_78._M_first;
  local_58._M_last = local_78._M_last;
  local_58._M_node = local_78._M_node;
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::erase(&local_30,c,&local_58);
  return;
}

Assistant:

static void deque_remove_element_at_index(deque<T> &c, size_t index) {
        c.erase(c.begin() + index);
    }